

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

void __thiscall
dxil_spv_converter_s::dxil_spv_converter_s
          (dxil_spv_converter_s *this,LLVMBCParser *bc_parser_,LLVMBCParser *bc_reflection_parser_)

{
  this->bc_parser = bc_parser_;
  this->bc_reflection_parser = bc_reflection_parser_;
  (this->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->spirv).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entry_point)._M_dataplus._M_p = (pointer)&(this->entry_point).field_2;
  (this->entry_point)._M_string_length = 0;
  (this->entry_point).field_2._M_local_buf[0] = '\0';
  (this->compiled_entry_point)._M_dataplus._M_p = (pointer)&(this->compiled_entry_point).field_2;
  (this->compiled_entry_point)._M_string_length = 0;
  (this->compiled_entry_point).field_2._M_local_buf[0] = '\0';
  (this->analysis_warnings)._M_dataplus._M_p = (pointer)&(this->analysis_warnings).field_2;
  (this->analysis_warnings)._M_string_length = 0;
  (this->analysis_warnings).field_2._M_local_buf[0] = '\0';
  (this->remapper).super_ResourceRemappingInterface._vptr_ResourceRemappingInterface =
       (_func_int **)&PTR__ResourceRemappingInterface_001e3140;
  memset(&(this->remapper).srv_remapper,0,0xd2);
  this->workgroup_size[0] = 0;
  this->workgroup_size[1] = 0;
  *(undefined8 *)(this->workgroup_size + 2) = 0;
  this->wave_size_min = 0;
  this->wave_size_max = 0;
  this->wave_size_preferred = 0;
  this->heuristic_wave_size = 0;
  this->shader_feature_used[0] = false;
  return;
}

Assistant:

dxil_spv_converter_s(LLVMBCParser &bc_parser_, LLVMBCParser *bc_reflection_parser_)
		: bc_parser(bc_parser_), bc_reflection_parser(bc_reflection_parser_)
	{
	}